

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CArgument *stm)

{
  bool bVar1;
  type type;
  pointer pCVar2;
  CError local_f8;
  TypeInfo local_c8;
  CError local_a0;
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  string errorMessage;
  bool isVisibleType;
  CArgument *stm_local;
  CTypeCheckerVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"typechecker: arg\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->id);
  if ((bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->type), bVar1))
  {
    type = std::unique_ptr<CType,_std::default_delete<CType>_>::operator*(&stm->type);
    bVar1 = checkTypeExisting(this,type);
    if (bVar1) {
      TypeInfo::TypeInfo(&local_c8,VOID);
      TypeInfo::operator=(&this->lastCalculatedType,&local_c8);
      TypeInfo::~TypeInfo(&local_c8);
    }
    else {
      std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&stm->type);
      CType::toString_abi_cxx11_((CType *)local_60);
      CError::GetUndeclaredErrorMessage((CError *)local_40,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      pCVar2 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&stm->type);
      CError::CError(&local_a0,(string *)local_40,
                     &(pCVar2->super_IWrapper).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_a0);
      CError::~CError(&local_a0);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  else {
    CError::CError(&local_f8,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_f8);
    CError::~CError(&local_f8);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CArgument &stm )  
{
	std::cout << "typechecker: arg\n";
    if( stm.id && stm.type ) {
        bool isVisibleType = checkTypeExisting(*stm.type);
        if( !isVisibleType ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.type->toString() );
            errors.push_back( CError( errorMessage, stm.type->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}